

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertToInteger
          (DoubleAPFloat *this,MutableArrayRef<unsigned_long> Input,uint Width,bool IsSigned,
          roundingMode RM,bool *IsExact)

{
  opStatus oVar1;
  undefined1 local_60 [8];
  IEEEFloat local_58;
  DoubleAPFloat local_40;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&local_40);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_60 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_40);
    oVar1 = APFloat::convertToInteger((APFloat *)local_60,Input,Width,IsSigned,RM,IsExact);
    APFloat::Storage::~Storage((Storage *)(local_60 + 8));
    APInt::~APInt((APInt *)&local_40);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10cf,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
               );
}

Assistant:

APFloat::opStatus
DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart> Input,
                                unsigned int Width, bool IsSigned,
                                roundingMode RM, bool *IsExact) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .convertToInteger(Input, Width, IsSigned, RM, IsExact);
}